

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void test_smoothsort(uint N_lists,uint list_max)

{
  int iVar1;
  time_t tVar2;
  ostream *poVar3;
  int *data;
  uint i;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  bool bVar7;
  ulong _N;
  sorted_ptr_arr<int> sorted_data;
  sorted_ptr_arr<int> local_40;
  
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  poVar3 = std::operator<<((ostream *)&std::cout,"Sorting ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3," lists of at most ");
  _N = (ulong)list_max;
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3," elements each...");
  for (uVar5 = 0; uVar5 != N_lists; uVar5 = uVar5 + 1) {
    data = (int *)operator_new__(_N * 4);
    for (uVar4 = 0; _N != uVar4; uVar4 = uVar4 + 1) {
      iVar1 = rand();
      data[uVar4] = (int)(((double)iVar1 * 100.0) / 2147483647.0);
    }
    sorted_ptr_arr<int>::sorted_ptr_arr(&local_40,data,_N);
    bVar7 = false;
    for (lVar6 = 0; local_40.N << 3 != lVar6; lVar6 = lVar6 + 8) {
      bVar7 = (bool)(bVar7 | **(int **)((long)&(local_40.ptr_arr)->element + lVar6) <
                             *(local_40.ptr_arr)->element);
    }
    if (bVar7) {
      poVar3 = std::operator<<((ostream *)&std::cout,"# NOT SORTED");
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    operator_delete__(data);
    sorted_ptr_arr<int>::~sorted_ptr_arr(&local_40);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"Done.");
  std::endl<char,std::char_traits<char>>(poVar3);
  return;
}

Assistant:

void test_smoothsort(unsigned int N_lists, unsigned int list_max) {
	srand(time(NULL));
	
	std::cout << "Sorting " << N_lists << " lists of at most " << list_max << " elements each..."; 
	for(unsigned int k=0; k<N_lists; k++) {
		unsigned int N = list_max;//= (int)((double)list_max*(double)rand()/(double)RAND_MAX)+1;
		int* test_input = new int[N];
		int* input_copy = new int[N];
		for(unsigned int i=0; i<N; i++) { test_input[i] = (int)(100*(double)rand()/(double)RAND_MAX); input_copy[i] = test_input[i]; }
		
		//std::cout << std::endl;
		//for(unsigned int i=0; i<N; i++) { std::cout << test_input[i] << "\t"; }
		//std::cout << std::endl << std::endl;
		
		sorted_ptr_arr<int> sorted_data(&test_input[0], N);
		int last = sorted_data[0];
		bool not_sorted = false;
		for(sorted_ptr_arr<int>::iterator it=sorted_data.begin(); it != sorted_data.end(); ++it) {
			if(last > *it) { not_sorted = true; }
			//std::cout << *it << "\t";
		}
		//std::cout << std::endl;
		if(not_sorted) { std::cout << "# NOT SORTED" << std::endl; }
		//std::cout << std::endl;
		
		
		delete[] test_input;
		delete[] input_copy;
	}
	std::cout << "Done." << std::endl;
}